

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O2

int32_t ucnv_swapAliases_63(UDataSwapper *ds,void *inData,int32_t length,void *outData,
                           UErrorCode *pErrorCode)

{
  void *pvVar1;
  void *__dest;
  size_t __n;
  ulong uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint32_t length_00;
  uint8_t uVar5;
  uint16_t uVar6;
  int32_t iVar7;
  uint32_t uVar8;
  uint uVar9;
  uint32_t uVar10;
  TempRow *pTVar11;
  long lVar12;
  void *pvVar13;
  ulong uVar14;
  uint uVar15;
  void *pvVar16;
  ulong uVar17;
  size_t sVar18;
  byte bVar19;
  long lVar20;
  ulong uVar21;
  undefined8 in_stack_fffffffffffff328;
  undefined4 uVar22;
  void *local_c78;
  TempRow *local_c70;
  TempRow *local_c68;
  code *local_c60;
  uint32_t offsets [10];
  uint32_t toc [10];
  uint16_t resort [500];
  TempRow rows [500];
  
  uVar22 = (undefined4)((ulong)in_stack_fffffffffffff328 >> 0x20);
  iVar7 = udata_swapDataHeader_63(ds,inData,length,outData,pErrorCode);
  if (pErrorCode == (UErrorCode *)0x0) {
    return 0;
  }
  if (U_ZERO_ERROR < *pErrorCode) {
    return 0;
  }
  bVar19 = *(byte *)((long)inData + 0xd);
  if ((((bVar19 != 0x76 || *(byte *)((long)inData + 0xc) != 0x43) ||
       (bVar19 = 0x76, *(char *)((long)inData + 0xe) != 'A')) ||
      (*(char *)((long)inData + 0xf) != 'l')) || (*(char *)((long)inData + 0x10) != '\x03')) {
    udata_printError_63(ds,
                        "ucnv_swapAliases(): data format %02x.%02x.%02x.%02x (format version %02x) is not an alias table\n"
                        ,(ulong)*(byte *)((long)inData + 0xc),(ulong)bVar19,
                        (ulong)*(byte *)((long)inData + 0xe),(ulong)*(byte *)((long)inData + 0xf),
                        CONCAT44(uVar22,(uint)*(byte *)((long)inData + 0x10)));
    *pErrorCode = U_UNSUPPORTED_ERROR;
    return 0;
  }
  if ((length < 0) || (uVar15 = length - iVar7, 0x23 < (int)uVar15)) {
    lVar20 = (long)iVar7;
    toc[4] = 0;
    toc[5] = 0;
    toc[6] = 0;
    toc[7] = 0;
    toc[0] = 0;
    toc[1] = 0;
    toc[2] = 0;
    toc[3] = 0;
    toc[8] = 0;
    toc[9] = 0;
    uVar8 = (*ds->readUInt32)(*(uint32_t *)((long)inData + lVar20));
    toc[0] = uVar8;
    if (uVar8 - 10 < 0xfffffffe) {
      udata_printError_63(ds,
                          "ucnv_swapAliases(): table of contents contains unsupported number of sections (%u sections)\n"
                         );
      *pErrorCode = U_INVALID_FORMAT_ERROR;
      return 0;
    }
    pvVar1 = (void *)((long)inData + lVar20);
    uVar9 = uVar8 + 1;
    for (uVar21 = 1; uVar9 != uVar21; uVar21 = uVar21 + 1) {
      uVar10 = (*ds->readUInt32)(*(uint32_t *)((long)pvVar1 + uVar21 * 4));
      toc[uVar21] = uVar10;
    }
    offsets[2] = 0;
    offsets[3] = 0;
    offsets[4] = 0;
    offsets[5] = 0;
    offsets[6] = 0;
    offsets[7] = 0;
    offsets[8] = 0;
    offsets[9] = 0;
    offsets._0_8_ = (ulong)(uVar9 * 2) << 0x20;
    for (lVar12 = 0; (ulong)uVar9 - 2 != lVar12; lVar12 = lVar12 + 1) {
      offsets[lVar12 + 2] = toc[lVar12 + 1] + offsets[lVar12 + 1];
    }
    uVar10 = toc[uVar8];
    uVar8 = offsets[uVar8];
    if (-1 < length) {
      uVar15 = length - iVar7;
      if ((int)uVar15 < (int)((uVar10 + uVar8) * 2)) goto LAB_001c847e;
      pvVar16 = (void *)(lVar20 + (long)outData);
      (*ds->swapArray32)(ds,pvVar1,uVar9 * 4,pvVar16,pErrorCode);
      uVar4 = offsets._32_8_;
      pvVar13 = (void *)((offsets._32_8_ & 0xffffffff) * 2 + (long)pvVar16);
      (*ds->swapInvChars)(ds,(void *)((long)pvVar1 + (offsets._32_8_ & 0xffffffff) * 2),
                          (toc[9] + toc[8]) * 2,pvVar13,pErrorCode);
      if (U_ZERO_ERROR < *pErrorCode) {
        udata_printError_63(ds,"ucnv_swapAliases().swapInvChars(charset names) failed\n");
        return 0;
      }
      uVar5 = ds->outCharset;
      if (ds->inCharset == uVar5) {
        uVar15 = offsets[1];
      }
      else {
        length_00 = toc[3];
        uVar21 = (ulong)toc[3];
        pTVar11 = rows;
        local_c78 = pvVar13;
        if (uVar21 < 0x1f5) {
          local_c68 = (TempRow *)resort;
        }
        else {
          pTVar11 = (TempRow *)uprv_malloc_63((ulong)(toc[3] * 2) + uVar21 * 4);
          if (pTVar11 == (TempRow *)0x0) {
            local_c70 = pTVar11;
            udata_printError_63(ds,
                                "ucnv_swapAliases(): unable to allocate memory for sorting tables (max length: %u)\n"
                                ,uVar21);
            *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
            return 0;
          }
          local_c68 = pTVar11 + uVar21;
          uVar5 = ds->outCharset;
        }
        uVar3 = offsets._8_8_;
        local_c60 = ucnv_io_stripEBCDICForCompare_63;
        if (uVar5 == '\0') {
          local_c60 = ucnv_io_stripASCIIForCompare_63;
        }
        uVar2 = (ulong)offsets._8_8_ >> 0x20;
        uVar14 = offsets._16_8_ & 0xffffffff;
        local_c70 = pTVar11;
        for (uVar17 = 0; uVar21 != uVar17; uVar17 = uVar17 + 1) {
          uVar6 = (*ds->readUInt16)(*(uint16_t *)((long)pvVar1 + uVar17 * 2 + uVar2 * 2));
          pTVar11[uVar17].strIndex = uVar6;
          pTVar11[uVar17].sortIndex = (uint16_t)uVar17;
        }
        uprv_sortArray_63(pTVar11,length_00,4,io_compareRows,&local_c78,'\0',pErrorCode);
        pTVar11 = local_c68;
        if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
          pvVar13 = (void *)((long)pvVar16 + uVar2 * 2);
          __dest = (void *)((long)pvVar16 + uVar14 * 2);
          if (inData == outData) {
            __n = uVar21 * 2;
            for (sVar18 = 0; __n != sVar18; sVar18 = sVar18 + 2) {
              (*ds->swapArray16)(ds,(void *)((long)pvVar1 +
                                            (ulong)(&local_c70->sortIndex)[sVar18] * 2 + uVar2 * 2),
                                 2,(void *)((long)&pTVar11->strIndex + sVar18),pErrorCode);
            }
            memcpy(pvVar13,pTVar11,__n);
            for (sVar18 = 0; __n != sVar18; sVar18 = sVar18 + 2) {
              (*ds->swapArray16)(ds,(void *)((long)pvVar1 +
                                            (ulong)(&local_c70->sortIndex)[sVar18] * 2 + uVar14 * 2)
                                 ,2,(void *)((long)&pTVar11->strIndex + sVar18),pErrorCode);
            }
            memcpy(__dest,pTVar11,__n);
          }
          else {
            for (lVar20 = 0; uVar21 * 2 != lVar20; lVar20 = lVar20 + 2) {
              uVar17 = (ulong)((uint)(&local_c70->sortIndex)[lVar20] * 2);
              (*ds->swapArray16)(ds,(void *)((long)pvVar1 + uVar17 + uVar2 * 2),2,
                                 (void *)((long)pvVar13 + lVar20),pErrorCode);
              (*ds->swapArray16)(ds,(void *)((long)pvVar1 + uVar17 + uVar14 * 2),2,
                                 (void *)((long)__dest + lVar20),pErrorCode);
            }
          }
        }
        if (local_c70 != rows) {
          uprv_free_63(local_c70);
        }
        if (U_ZERO_ERROR < *pErrorCode) {
          udata_printError_63(ds,"ucnv_swapAliases().uprv_sortArray(%u items) failed\n",uVar21);
          return 0;
        }
        (*ds->swapArray16)(ds,(void *)((ulong)offsets[1] * 2 + (long)pvVar1),
                           (SUB84(uVar3,4) - offsets[1]) * 2,
                           (void *)((long)pvVar16 + (ulong)offsets[1] * 2),pErrorCode);
        uVar15 = offsets[5];
      }
      (*ds->swapArray16)(ds,(void *)((long)pvVar1 + (ulong)uVar15 * 2),
                         ((uint32_t)uVar4 - uVar15) * 2,(void *)((long)pvVar16 + (ulong)uVar15 * 2),
                         pErrorCode);
    }
    iVar7 = (uVar10 + uVar8) * 2 + iVar7;
  }
  else {
LAB_001c847e:
    iVar7 = 0;
    udata_printError_63(ds,
                        "ucnv_swapAliases(): too few bytes (%d after header) for an alias table\n",
                        (ulong)uVar15);
    *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
  }
  return iVar7;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucnv_swapAliases(const UDataSwapper *ds,
                 const void *inData, int32_t length, void *outData,
                 UErrorCode *pErrorCode) {
    const UDataInfo *pInfo;
    int32_t headerSize;

    const uint16_t *inTable;
    const uint32_t *inSectionSizes;
    uint32_t toc[offsetsCount];
    uint32_t offsets[offsetsCount]; /* 16-bit-addressed offsets from inTable/outTable */
    uint32_t i, count, tocLength, topOffset;

    TempRow rows[STACK_ROW_CAPACITY];
    uint16_t resort[STACK_ROW_CAPACITY];
    TempAliasTable tempTable;

    /* udata_swapDataHeader checks the arguments */
    headerSize=udata_swapDataHeader(ds, inData, length, outData, pErrorCode);
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }

    /* check data format and format version */
    pInfo=(const UDataInfo *)((const char *)inData+4);
    if(!(
        pInfo->dataFormat[0]==0x43 &&   /* dataFormat="CvAl" */
        pInfo->dataFormat[1]==0x76 &&
        pInfo->dataFormat[2]==0x41 &&
        pInfo->dataFormat[3]==0x6c &&
        pInfo->formatVersion[0]==3
    )) {
        udata_printError(ds, "ucnv_swapAliases(): data format %02x.%02x.%02x.%02x (format version %02x) is not an alias table\n",
                         pInfo->dataFormat[0], pInfo->dataFormat[1],
                         pInfo->dataFormat[2], pInfo->dataFormat[3],
                         pInfo->formatVersion[0]);
        *pErrorCode=U_UNSUPPORTED_ERROR;
        return 0;
    }

    /* an alias table must contain at least the table of contents array */
    if(length>=0 && (length-headerSize)<4*(1+minTocLength)) {
        udata_printError(ds, "ucnv_swapAliases(): too few bytes (%d after header) for an alias table\n",
                         length-headerSize);
        *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }

    inSectionSizes=(const uint32_t *)((const char *)inData+headerSize);
    inTable=(const uint16_t *)inSectionSizes;
    uprv_memset(toc, 0, sizeof(toc));
    toc[tocLengthIndex]=tocLength=ds->readUInt32(inSectionSizes[tocLengthIndex]);
    if(tocLength<minTocLength || offsetsCount<=tocLength) {
        udata_printError(ds, "ucnv_swapAliases(): table of contents contains unsupported number of sections (%u sections)\n", tocLength);
        *pErrorCode=U_INVALID_FORMAT_ERROR;
        return 0;
    }

    /* read the known part of the table of contents */
    for(i=converterListIndex; i<=tocLength; ++i) {
        toc[i]=ds->readUInt32(inSectionSizes[i]);
    }

    /* compute offsets */
    uprv_memset(offsets, 0, sizeof(offsets));
    offsets[converterListIndex]=2*(1+tocLength); /* count two 16-bit units per toc entry */
    for(i=tagListIndex; i<=tocLength; ++i) {
        offsets[i]=offsets[i-1]+toc[i-1];
    }

    /* compute the overall size of the after-header data, in numbers of 16-bit units */
    topOffset=offsets[i-1]+toc[i-1];

    if(length>=0) {
        uint16_t *outTable;
        const uint16_t *p, *p2;
        uint16_t *q, *q2;
        uint16_t oldIndex;

        if((length-headerSize)<(2*(int32_t)topOffset)) {
            udata_printError(ds, "ucnv_swapAliases(): too few bytes (%d after header) for an alias table\n",
                             length-headerSize);
            *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }

        outTable=(uint16_t *)((char *)outData+headerSize);

        /* swap the entire table of contents */
        ds->swapArray32(ds, inTable, 4*(1+tocLength), outTable, pErrorCode);

        /* swap unormalized strings & normalized strings */
        ds->swapInvChars(ds, inTable+offsets[stringTableIndex], 2*(int32_t)(toc[stringTableIndex]+toc[normalizedStringTableIndex]),
                             outTable+offsets[stringTableIndex], pErrorCode);
        if(U_FAILURE(*pErrorCode)) {
            udata_printError(ds, "ucnv_swapAliases().swapInvChars(charset names) failed\n");
            return 0;
        }

        if(ds->inCharset==ds->outCharset) {
            /* no need to sort, just swap all 16-bit values together */
            ds->swapArray16(ds,
                            inTable+offsets[converterListIndex],
                            2*(int32_t)(offsets[stringTableIndex]-offsets[converterListIndex]),
                            outTable+offsets[converterListIndex],
                            pErrorCode);
        } else {
            /* allocate the temporary table for sorting */
            count=toc[aliasListIndex];

            tempTable.chars=(const char *)(outTable+offsets[stringTableIndex]); /* sort by outCharset */

            if(count<=STACK_ROW_CAPACITY) {
                tempTable.rows=rows;
                tempTable.resort=resort;
            } else {
                tempTable.rows=(TempRow *)uprv_malloc(count*sizeof(TempRow)+count*2);
                if(tempTable.rows==NULL) {
                    udata_printError(ds, "ucnv_swapAliases(): unable to allocate memory for sorting tables (max length: %u)\n",
                                     count);
                    *pErrorCode=U_MEMORY_ALLOCATION_ERROR;
                    return 0;
                }
                tempTable.resort=(uint16_t *)(tempTable.rows+count);
            }

            if(ds->outCharset==U_ASCII_FAMILY) {
                tempTable.stripForCompare=ucnv_io_stripASCIIForCompare;
            } else /* U_EBCDIC_FAMILY */ {
                tempTable.stripForCompare=ucnv_io_stripEBCDICForCompare;
            }

            /*
             * Sort unique aliases+mapped names.
             *
             * We need to sort the list again by outCharset strings because they
             * sort differently for different charset families.
             * First we set up a temporary table with the string indexes and
             * sorting indexes and sort that.
             * Then we permutate and copy/swap the actual values.
             */
            p=inTable+offsets[aliasListIndex];
            q=outTable+offsets[aliasListIndex];

            p2=inTable+offsets[untaggedConvArrayIndex];
            q2=outTable+offsets[untaggedConvArrayIndex];

            for(i=0; i<count; ++i) {
                tempTable.rows[i].strIndex=ds->readUInt16(p[i]);
                tempTable.rows[i].sortIndex=(uint16_t)i;
            }

            uprv_sortArray(tempTable.rows, (int32_t)count, sizeof(TempRow),
                           io_compareRows, &tempTable,
                           FALSE, pErrorCode);

            if(U_SUCCESS(*pErrorCode)) {
                /* copy/swap/permutate items */
                if(p!=q) {
                    for(i=0; i<count; ++i) {
                        oldIndex=tempTable.rows[i].sortIndex;
                        ds->swapArray16(ds, p+oldIndex, 2, q+i, pErrorCode);
                        ds->swapArray16(ds, p2+oldIndex, 2, q2+i, pErrorCode);
                    }
                } else {
                    /*
                     * If we swap in-place, then the permutation must use another
                     * temporary array (tempTable.resort)
                     * before the results are copied to the outBundle.
                     */
                    uint16_t *r=tempTable.resort;

                    for(i=0; i<count; ++i) {
                        oldIndex=tempTable.rows[i].sortIndex;
                        ds->swapArray16(ds, p+oldIndex, 2, r+i, pErrorCode);
                    }
                    uprv_memcpy(q, r, 2*(size_t)count);

                    for(i=0; i<count; ++i) {
                        oldIndex=tempTable.rows[i].sortIndex;
                        ds->swapArray16(ds, p2+oldIndex, 2, r+i, pErrorCode);
                    }
                    uprv_memcpy(q2, r, 2*(size_t)count);
                }
            }

            if(tempTable.rows!=rows) {
                uprv_free(tempTable.rows);
            }

            if(U_FAILURE(*pErrorCode)) {
                udata_printError(ds, "ucnv_swapAliases().uprv_sortArray(%u items) failed\n",
                                 count);
                return 0;
            }

            /* swap remaining 16-bit values */
            ds->swapArray16(ds,
                            inTable+offsets[converterListIndex],
                            2*(int32_t)(offsets[aliasListIndex]-offsets[converterListIndex]),
                            outTable+offsets[converterListIndex],
                            pErrorCode);
            ds->swapArray16(ds,
                            inTable+offsets[taggedAliasArrayIndex],
                            2*(int32_t)(offsets[stringTableIndex]-offsets[taggedAliasArrayIndex]),
                            outTable+offsets[taggedAliasArrayIndex],
                            pErrorCode);
        }
    }

    return headerSize+2*(int32_t)topOffset;
}